

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264e_slice.c
# Opt level: O1

MPP_RET h264e_reorder_wr_op(H264eReorderInfo *info,H264eRplmo *op)

{
  H264eRplmo *pHVar1;
  int iVar2;
  RK_S32 RVar3;
  RK_S32 RVar4;
  RK_S32 RVar5;
  
  iVar2 = info->wr_cnt;
  if (iVar2 < info->size) {
    info->wr_cnt = iVar2 + 1;
    RVar3 = op->abs_diff_pic_num_minus1;
    RVar4 = op->long_term_pic_idx;
    RVar5 = op->abs_diff_view_idx_minus1;
    pHVar1 = info->ops + iVar2;
    pHVar1->modification_of_pic_nums_idc = op->modification_of_pic_nums_idc;
    pHVar1->abs_diff_pic_num_minus1 = RVar3;
    pHVar1->long_term_pic_idx = RVar4;
    pHVar1->abs_diff_view_idx_minus1 = RVar5;
    return MPP_OK;
  }
  _mpp_log_l(2,"h264e_slice","write too many reorder op %d vs %d\n","h264e_reorder_wr_op");
  return MPP_NOK;
}

Assistant:

MPP_RET h264e_reorder_wr_op(H264eReorderInfo *info, H264eRplmo *op)
{
    if (info->wr_cnt >= info->size) {
        mpp_err_f("write too many reorder op %d vs %d\n",
                  info->wr_cnt, info->size);
        return MPP_NOK;
    }

    info->ops[info->wr_cnt++] = *op;
    return MPP_OK;
}